

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O1

int use_tinning_kit(obj *obj)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  obj *obj_00;
  obj *obj_01;
  char *pcVar5;
  char kbuf [256];
  char premsg [256];
  char acStack_228 [256];
  char local_128 [264];
  
  if (obj->spe < '\x01') {
    pcVar5 = "You seem to be out of tins.";
LAB_001456bf:
    pline(pcVar5);
  }
  else {
    obj_00 = floorfood("tin");
    if (obj_00 == (obj *)0x0) {
      return 0;
    }
    if ((obj_00->otyp == 0x10e) && ((obj_00->oeaten != 0 || ((obj_00->field_0x4d & 8) != 0)))) {
      pcVar5 = "You cannot tin something which is partly eaten.";
      goto LAB_001456d8;
    }
    if ((((obj_00->corpsenm == 0xc) || (obj_00->corpsenm == 0xb)) && (u.uprops[8].extrinsic == 0))
       && ((((byte)youmonst.mintrinsics & 0x80) == 0 && (uarmg == (obj *)0x0)))) {
      memset(local_128,0,0x100);
      memset(acStack_228,0,0x100);
      bVar1 = poly_when_stoned(youmonst.data);
      pcVar5 = mons_mname(mons + obj_00->corpsenm);
      pcVar5 = an(pcVar5);
      if (bVar1 == '\0') {
        snprintf(local_128,0x100,"Tinning %s without wearing gloves is a fatal mistake...",pcVar5);
        pcVar5 = mons_mname(mons + obj_00->corpsenm);
        pcVar5 = an(pcVar5);
        snprintf(acStack_228,0x100,"trying to tin %s without gloves",pcVar5);
      }
      else {
        pline("You start tinning %s without wearing gloves.",pcVar5);
      }
      bVar1 = delayed_petrify(local_128,acStack_228);
      if (bVar1 != '\0') {
        pcVar5 = "You stop your tinning attempt.";
        goto LAB_001456bf;
      }
    }
    if (obj_00->corpsenm - 0x144U < 3) {
      revive_corpse(obj_00);
      verbalize("Yes...  But War does not preserve its enemies...");
    }
    else {
      if (mons[obj_00->corpsenm].cnutrit == 0) {
        pcVar5 = "That\'s too insubstantial to tin.";
LAB_001456d8:
        pline(pcVar5);
        return 0;
      }
      consume_obj_charge(obj,'\x01');
      obj_01 = mksobj(level,0x129,'\0','\0');
      if (obj_01 == (obj *)0x0) {
        warning("Tinning failed.");
        return 1;
      }
      iVar2 = undead_to_corpse(obj_00->corpsenm);
      obj_01->corpsenm = iVar2;
      uVar3 = *(uint *)&obj->field_0x4a & 1;
      uVar4 = *(uint *)&obj_01->field_0x4a;
      *(uint *)&obj_01->field_0x4a = uVar4 & 0xfffffffe | uVar3;
      *(uint *)&obj_01->field_0x4a = uVar4 & 0xfffffffc | uVar3 | *(uint *)&obj->field_0x4a & 2;
      uVar4 = weight(obj_01);
      obj_01->owt = uVar4;
      obj_01->field_0x4a = obj_01->field_0x4a | 0x10;
      obj_01->spe = -1;
      if (obj_00->where == '\x03') {
        if ((obj_00->field_0x4a & 4) != 0) {
          verbalize("You tin it, you bought it!");
        }
        useup(obj_00);
      }
      else {
        bVar1 = costly_spot(obj_00->ox,obj_00->oy);
        if ((bVar1 != '\0') && ((obj_00->field_0x4a & 8) == 0)) {
          verbalize("You tin it, you bought it!");
        }
        useupf(obj_00,1);
      }
      pcVar5 = doname(obj_01);
      hold_another_object(obj_01,"You make, but cannot pick up, %s.",pcVar5,(char *)0x0);
    }
  }
  return 1;
}

Assistant:

static int use_tinning_kit(struct obj *obj)
{
	struct obj *corpse, *can;

	/* This takes only 1 move.  If this is to be changed to take many
	 * moves, we've got to deal with decaying corpses...
	 */
	if (obj->spe <= 0) {
		pline("You seem to be out of tins.");
		return 1;
	}
	if (!(corpse = floorfood("tin"))) return 0;
	if (corpse->otyp == CORPSE && (corpse->oeaten || corpse->odrained)) {
		pline("You cannot tin something which is partly eaten.");
		return 0;
	}
	if (touch_petrifies(&mons[corpse->corpsenm])
		&& !Stone_resistance && !uarmg) {
	    char premsg[BUFSZ] = "";
	    char kbuf[BUFSZ] = "";
	    if (poly_when_stoned(youmonst.data)) {
		pline("You start tinning %s without wearing gloves.",
			an(mons_mname(&mons[corpse->corpsenm])));
	    } else {
		snprintf(premsg, BUFSZ,
			 "Tinning %s without wearing gloves is a fatal mistake...",
			 an(mons_mname(&mons[corpse->corpsenm])));
		snprintf(kbuf, BUFSZ,
			 "trying to tin %s without gloves",
			 an(mons_mname(&mons[corpse->corpsenm])));
	    }
	    if (delayed_petrify(premsg, kbuf)) {
		pline("You stop your tinning attempt.");
		return 1;
	    }
	}
	if (is_rider(&mons[corpse->corpsenm])) {
		revive_corpse(corpse);
		verbalize("Yes...  But War does not preserve its enemies...");
		return 1;
	}
	if (mons[corpse->corpsenm].cnutrit == 0) {
		pline("That's too insubstantial to tin.");
		return 0;
	}
	consume_obj_charge(obj, TRUE);

	if ((can = mksobj(level, TIN, FALSE, FALSE)) != 0) {
	    static const char you_buy_it[] = "You tin it, you bought it!";

	    /* Permit giant zombies to still produce tins of giant meat. */
	    can->corpsenm = undead_to_corpse(corpse->corpsenm);
	    can->cursed = obj->cursed;
	    can->blessed = obj->blessed;
	    can->owt = weight(can);
	    can->known = 1;
	    can->spe = -1;  /* Mark tinned tins. No spinach allowed... */
	    if (carried(corpse)) {
		if (corpse->unpaid)
		    verbalize(you_buy_it);
		useup(corpse);
	    } else {
		if (costly_spot(corpse->ox, corpse->oy) && !corpse->no_charge)
		    verbalize(you_buy_it);
		useupf(corpse, 1L);
	    }
	    hold_another_object(can, "You make, but cannot pick up, %s.",
				doname(can), NULL);
	} else warning("Tinning failed.");
	return 1;
}